

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O3

void asm_setupresult(ASMState *as,IRIns *ir,CCallInfo *ci)

{
  byte bVar1;
  MCode *pMVar2;
  byte bVar3;
  MCode MVar4;
  MCode *pMVar5;
  Reg r;
  int iVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  
  bVar3 = (ir->field_1).r & 0x1f;
  uVar8 = 0xffff0fc7;
  if (-1 < (char)(ir->field_1).r) {
    uVar8 = -2 << bVar3 | 0xfffffffeU >> 0x20 - bVar3;
  }
  ra_evictset(as,uVar8 & (ci->flags & 0x400) * 0x40 - 0xf039);
  bVar3 = (ir->field_1).r;
  if (((char)bVar3 < '\0') && ((ir->field_1).s == '\0')) {
    return;
  }
  if ((byte)(((ir->field_1).t.irt & 0x1f) - 0xd) < 2) {
    if ((ci->flags & 0x200) != 0) {
      bVar1 = (ir->field_1).s;
      if (-1 < (char)bVar3) {
        iVar6 = 1 << (bVar3 & 0x1f);
        uVar9._0_4_ = as->freeset;
        uVar9._4_4_ = as->modset;
        uVar9 = CONCAT44(iVar6,iVar6) | uVar9;
        as->freeset = (int)uVar9;
        as->modset = (int)(uVar9 >> 0x20);
        pMVar2 = as->mcp;
        pMVar2[-1] = bVar3 * '\b' | 0xc0;
        pMVar2[-5] = 'f';
        pMVar2[-4] = 'f';
        pMVar2[-3] = '\x0f';
        pMVar2[-2] = 'n';
        pMVar2[-4] = bVar3 >> 1 & 4 | 0x48;
        as->mcp = pMVar2 + -5;
      }
      if (bVar1 == 0) {
        return;
      }
      pMVar2 = as->mcp;
      if (bVar1 < 0x20) {
        pMVar2[-1] = (MCode)((uint)bVar1 << 2);
        MVar4 = 'D';
        lVar7 = -1;
      }
      else {
        *(uint *)(pMVar2 + -4) = (uint)bVar1 << 2;
        MVar4 = 0x84;
        lVar7 = -4;
      }
      pMVar5 = pMVar2 + lVar7 + -4;
      pMVar2[lVar7 + -1] = '$';
      pMVar2[lVar7 + -2] = MVar4;
      pMVar5[0] = 'H';
      pMVar5[1] = 0x89;
      as->mcp = pMVar5;
      return;
    }
    r = 0x10;
  }
  else {
    r = 0;
  }
  ra_destreg(as,ir,r);
  return;
}

Assistant:

static void asm_setupresult(ASMState *as, IRIns *ir, const CCallInfo *ci)
{
  RegSet drop = RSET_SCRATCH;
  int hiop = (LJ_32 && (ir+1)->o == IR_HIOP && !irt_isnil((ir+1)->t));
  if ((ci->flags & CCI_NOFPRCLOBBER))
    drop &= ~RSET_FPR;
  if (ra_hasreg(ir->r))
    rset_clear(drop, ir->r);  /* Dest reg handled below. */
  if (hiop && ra_hasreg((ir+1)->r))
    rset_clear(drop, (ir+1)->r);  /* Dest reg handled below. */
  ra_evictset(as, drop);  /* Evictions must be performed first. */
  if (ra_used(ir)) {
    if (irt_isfp(ir->t)) {
      int32_t ofs = sps_scale(ir->s);  /* Use spill slot or temp slots. */
#if LJ_64
      if ((ci->flags & CCI_CASTU64)) {
	Reg dest = ir->r;
	if (ra_hasreg(dest)) {
	  ra_free(as, dest);
	  ra_modified(as, dest);
	  emit_rr(as, XO_MOVD, dest|REX_64, RID_RET);  /* Really MOVQ. */
	}
	if (ofs) emit_movtomro(as, RID_RET|REX_64, RID_ESP, ofs);
      } else {
	ra_destreg(as, ir, RID_FPRET);
      }
#else
      /* Number result is in x87 st0 for x86 calling convention. */
      Reg dest = ir->r;
      if (ra_hasreg(dest)) {
	ra_free(as, dest);
	ra_modified(as, dest);
	emit_rmro(as, irt_isnum(ir->t) ? XO_MOVSD : XO_MOVSS,
		  dest, RID_ESP, ofs);
      }
      if ((ci->flags & CCI_CASTU64)) {
	emit_movtomro(as, RID_RETLO, RID_ESP, ofs);
	emit_movtomro(as, RID_RETHI, RID_ESP, ofs+4);
      } else {
	emit_rmro(as, irt_isnum(ir->t) ? XO_FSTPq : XO_FSTPd,
		  irt_isnum(ir->t) ? XOg_FSTPq : XOg_FSTPd, RID_ESP, ofs);
      }
#endif
#if LJ_32
    } else if (hiop) {
      ra_destpair(as, ir);
#endif
    } else {
      lj_assertA(!irt_ispri(ir->t), "PRI dest");
      ra_destreg(as, ir, RID_RET);
    }
  } else if (LJ_32 && irt_isfp(ir->t) && !(ci->flags & CCI_CASTU64)) {
    emit_x87op(as, XI_FPOP);  /* Pop unused result from x87 st0. */
  }
}